

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O3

void duckdb::RemapEntry::HandleDefault
               (idx_t default_idx,string *default_target,LogicalType *default_type,
               case_insensitive_map_t<RemapIndex> *target_map,
               case_insensitive_map_t<RemapEntry> *result)

{
  LogicalType *rhs;
  pointer pcVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var2;
  bool bVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_true>
  _Var5;
  pointer __p;
  child_list_t<LogicalType> *this;
  const_reference default_target_00;
  type target_map_00;
  type result_00;
  BinderException *pBVar6;
  idx_t __n;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_false,_true>,_bool>
  pVar7;
  RemapEntry remap;
  string local_f8;
  undefined1 local_d8 [40];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  LogicalType local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&target_map->_M_h,default_target);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Default value %s not found for remap","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (default_target->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + default_target->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar6,(string *)local_d8,&local_50);
    __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_d8._0_8_ = (pointer)0xffffffffffffffff;
  local_d8._8_8_ = 0xffffffffffffffff;
  LogicalType::LogicalType((LogicalType *)(local_d8 + 0x10));
  local_b0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)0x0;
  optional_idx::optional_idx((optional_idx *)&local_f8,default_idx);
  rhs = (LogicalType *)
        ((long)iVar4.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
               ._M_cur + 0x30);
  local_d8._8_8_ = local_f8._M_dataplus._M_p;
  if (rhs->id_ == STRUCT) {
    if (default_type->id_ != STRUCT) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "Target value is a struct - default value should also be a struct","");
      BinderException::BinderException(pBVar6,&local_f8);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var5._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&result->_M_h,default_target);
    if (_Var5._M_cur == (__node_type *)0x0) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string_const&,duckdb::RemapEntry>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)result,default_target,local_d8);
      _Var5._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&result->_M_h,default_target);
      __p = (pointer)operator_new(0x38);
      (__p->_M_h)._M_rehash_policy._M_max_load_factor = 0.0;
      *(undefined4 *)&(__p->_M_h)._M_rehash_policy.field_0x4 = 0;
      (__p->_M_h)._M_rehash_policy._M_next_resize = 0;
      (__p->_M_h)._M_buckets = &(__p->_M_h)._M_single_bucket;
      (__p->_M_h)._M_bucket_count = 1;
      (__p->_M_h)._M_before_begin = (_Hash_node_base *)0x0;
      (__p->_M_h)._M_element_count = 0;
      (__p->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined1 (*) [16])&(__p->_M_h)._M_rehash_policy._M_next_resize = (undefined1  [16])0x0;
      ::std::
      __uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>_>
      ::reset((__uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>_>
               *)((long)_Var5._M_cur + 0x50),__p);
    }
    else {
      optional_idx::optional_idx((optional_idx *)&local_f8,default_idx);
      *(pointer *)((long)_Var5._M_cur + 0x30) = local_f8._M_dataplus._M_p;
    }
    this = StructType::GetChildTypes_abi_cxx11_(default_type);
    if ((this->
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        default_target_00 =
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::operator[](this,__n);
        target_map_00 =
             unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
             ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                          *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                                   ._M_cur + 0x48));
        result_00 = unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                    ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                                 *)((long)&((_Var5._M_cur)->
                                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>
                                           ._M_storage._M_storage + 0x48));
        HandleDefault(__n,&default_target_00->first,&default_target_00->second,target_map_00,
                      result_00);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this->
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
    }
  }
  else {
    bVar3 = LogicalType::operator==(default_type,rhs);
    if (!bVar3) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Default key %s does not match target type %s - add a cast","")
      ;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (default_target->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + default_target->_M_string_length);
      LogicalType::LogicalType(&local_88,rhs);
      BinderException::BinderException<std::__cxx11::string,duckdb::LogicalType>
                (pBVar6,&local_f8,&local_70,&local_88);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pVar7 = ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,duckdb::RemapEntry>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)result,default_target,local_d8);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Duplicate value provided for target %s","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar1 = (default_target->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar1,pcVar1 + default_target->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar6,&local_f8,&local_a8);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  p_Var2 = local_b0;
  if (local_b0 !=
      (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_b0);
    operator_delete(p_Var2);
  }
  local_b0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)0x0;
  LogicalType::~LogicalType((LogicalType *)(local_d8 + 0x10));
  return;
}

Assistant:

static void HandleDefault(idx_t default_idx, const string &default_target, const LogicalType &default_type,
	                          case_insensitive_map_t<RemapIndex> &target_map,
	                          case_insensitive_map_t<RemapEntry> &result) {
		auto entry = target_map.find(default_target);
		if (entry == target_map.end()) {
			throw BinderException("Default value %s not found for remap", default_target);
		}
		auto &target_type = entry->second.type;

		RemapEntry remap;
		remap.default_index = default_idx;
		if (target_type.id() == LogicalTypeId::STRUCT) {
			// nested remap - recurse
			if (default_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException("Target value is a struct - default value should also be a struct");
			}
			// add to the map at this level only if it does not yet exist
			auto result_entry = result.find(default_target);
			if (result_entry == result.end()) {
				result.emplace(default_target, std::move(remap));
				result_entry = result.find(default_target);
				result_entry->second.child_remaps = make_uniq<case_insensitive_map_t<RemapEntry>>();
			} else {
				// the entry exists - add the default index
				result_entry->second.default_index = default_idx;
			}
			auto &child_types = StructType::GetChildTypes(default_type);
			for (idx_t child_idx = 0; child_idx < child_types.size(); child_idx++) {
				auto &child_default = child_types[child_idx];
				HandleDefault(child_idx, child_default.first, child_default.second, *entry->second.child_map,
				              *result_entry->second.child_remaps);
			}
			return;
		}
		// non-nested type - add it to the map
		if (default_type != target_type) {
			throw BinderException("Default key %s does not match target type %s - add a cast", default_target,
			                      target_type);
		}
		auto added = result.emplace(default_target, std::move(remap));
		if (!added.second) {
			throw BinderException("Duplicate value provided for target %s", default_target);
		}
	}